

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<float,_true>::WriteValue
          (RLECompressState<float,_true> *this,float value,rle_count_t count,bool is_null)

{
  __int_type _Var1;
  data_ptr_t pdVar2;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  pointer pCVar3;
  byte in_DL;
  ushort in_SI;
  __atomic_base<unsigned_long> *in_RDI;
  undefined4 in_XMM0_Da;
  unsigned_long row_start;
  rle_count_t *index_pointer;
  float *data_pointer;
  data_ptr_t handle_ptr;
  idx_t in_stack_00000058;
  RLECompressState<float,_true> *in_stack_00000060;
  undefined8 in_stack_ffffffffffffffb8;
  float new_value;
  BaseStatistics *in_stack_ffffffffffffffc0;
  
  new_value = (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pdVar2 = BufferHandle::Ptr((BufferHandle *)0xa67df2);
  _Var1 = in_RDI[0xd]._M_i;
  *(undefined4 *)(pdVar2 + in_RDI[0xc]._M_i * 4 + 8) = in_XMM0_Da;
  *(ushort *)(pdVar2 + in_RDI[0xc]._M_i * 2 + _Var1 * 4 + 8) = in_SI;
  in_RDI[0xc]._M_i = in_RDI[0xc]._M_i + 1;
  if ((in_DL & 1) == 0) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)in_stack_ffffffffffffffc0);
    BaseStatistics::UpdateNumericStats<float>(in_stack_ffffffffffffffc0,new_value);
  }
  this_00 = (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
            (ulong)in_SI;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,(__int_type)this_00);
  if (in_RDI[0xc]._M_i == in_RDI[0xd]._M_i) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              (this_00);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              (this_00);
    ::std::__atomic_base::operator_cast_to_unsigned_long(in_RDI);
    FlushSegment(this);
    CreateEmptySegment(in_stack_00000060,in_stack_00000058);
    in_RDI[0xc]._M_i = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}